

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall
JsonString_ControlCharacterUTF16_Test::JsonString_ControlCharacterUTF16_Test
          (JsonString_ControlCharacterUTF16_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001ad458;
  return;
}

Assistant:

TEST_F (JsonString, ControlCharacterUTF16) {
    EXPECT_CALL (callbacks_, string_value ("\t")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input (R"("\u0009")").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}